

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O1

int output_instruction(Function *fn,Instruction *insn)

{
  TextBuffer *mb;
  char cVar1;
  Constant *pCVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  Pseudo *pPVar7;
  Pseudo *pPVar8;
  Pseudo *pPVar9;
  Ravi_CompilerInterface *pRVar10;
  char *pcVar11;
  char *pcVar12;
  void *pvVar13;
  char *pcVar14;
  undefined8 uVar15;
  bool bVar16;
  
  (fn->tb).pos = 0;
  raviX_output_instruction(insn,&fn->tb);
  mb = &fn->body;
  raviX_buffer_add_fstring(mb,"// %s\n",(fn->tb).buf);
  (fn->tb).pos = 0;
  cVar1 = *(char *)insn;
  switch(cVar1) {
  case '\x01':
    emit_op_ret(fn,insn);
    break;
  case '\x02':
  case '\x06':
  case '\v':
    raviX_buffer_add_string(mb,"{\n");
    pPVar7 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->targets,0);
    raviX_buffer_add_string(mb," TValue *ra = ");
    emit_reg_accessor(fn,pPVar7,0);
    raviX_buffer_add_string(mb,";\n");
    cVar1 = *(char *)insn;
    if (cVar1 == '\x02') {
      pcVar14 = "TM_ADD";
      pcVar12 = "+";
    }
    else if (cVar1 == '\v') {
      pcVar14 = "TM_MUL";
      pcVar12 = "*";
    }
    else {
      if (cVar1 != '\x06') goto switchD_0011f36a_caseD_31;
      pcVar14 = "TM_SUB";
      pcVar12 = "-";
    }
    raviX_buffer_add_string(mb," TValue *rb = ");
    pPVar7 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,0);
    emit_reg_accessor(fn,pPVar7,0);
    raviX_buffer_add_string(mb,";\n");
    raviX_buffer_add_string(mb," TValue *rc = ");
    pPVar7 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,1);
    emit_reg_accessor(fn,pPVar7,0);
    raviX_buffer_add_string(mb,";\n");
    raviX_buffer_add_string(mb," lua_Integer i = 0;\n");
    raviX_buffer_add_string(mb," lua_Integer ic = 0;\n");
    raviX_buffer_add_string(mb," lua_Number n = 0.0;\n");
    raviX_buffer_add_string(mb," lua_Number nc = 0.0;\n");
    raviX_buffer_add_string(mb," if (ttisinteger(rb) && ttisinteger(rc)) {\n");
    raviX_buffer_add_string(mb,"  i = ivalue(rb);\n");
    raviX_buffer_add_string(mb,"  ic = ivalue(rc);\n");
    raviX_buffer_add_fstring(mb,"  setivalue(ra, (i %s ic));\n",pcVar12);
    raviX_buffer_add_string(mb," } else if (tonumberns(rb, n) && tonumberns(rc, nc)) {\n");
    raviX_buffer_add_fstring(mb,"  setfltvalue(ra, (n %s nc));\n",pcVar12);
    raviX_buffer_add_string(mb," } else {\n");
    raviX_buffer_add_fstring(mb,"  luaT_trybinTM(L, rb, rc, ra, %s);\n",pcVar14);
    raviX_buffer_add_string(mb,"  base = ci->u.l.base;\n");
    pcVar14 = " }\n";
    goto LAB_0011f6da;
  case '\x03':
  case '\x05':
  case '\a':
  case '\n':
  case '\f':
  case '\x0e':
  case '\x10':
  case '\x13':
  case '\x16':
  case '\x18':
  case '\x1a':
    raviX_buffer_add_string(mb,"{ ");
    pPVar7 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->targets,0);
    if ((*(uint *)pPVar7 & 0xf) - 1 < 3) {
      emit_varname(fn,pPVar7);
      pcVar14 = " = ";
    }
    else {
      raviX_buffer_add_string(mb,"TValue *dst_reg = ");
      emit_reg_accessor(fn,pPVar7,0);
      if ((*(byte *)insn < 0x11) && ((0x11088U >> (*(byte *)insn & 0x1f) & 1) != 0)) {
        pcVar14 = "; setfltvalue(dst_reg, ";
      }
      else {
        pcVar14 = "; setivalue(dst_reg, ";
      }
    }
    raviX_buffer_add_string(mb,pcVar14);
    bVar3 = *(char *)insn - 3;
    if ((0x17 < bVar3) || ((0xa92a95U >> (bVar3 & 0x1f) & 1) == 0)) {
switchD_0011f36a_caseD_31:
      pRVar10 = fn->api;
      pvVar13 = pRVar10->context;
      pcVar14 = "Unexpected opcode";
LAB_001207c2:
      (*pRVar10->error_message)(pvVar13,pcVar14);
      longjmp((__jmp_buf_tag *)fn->env,1);
    }
    iVar6 = *(int *)(&DAT_0013d4d0 + (ulong)bVar3 * 4);
    pPVar8 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,0);
    emit_varname_or_constant(fn,pPVar8);
    raviX_buffer_add_fstring(mb," %s ",&DAT_0013d4d0 + iVar6);
    pPVar8 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,1);
    emit_varname_or_constant(fn,pPVar8);
    if ((*(uint *)pPVar7 & 0xf) - 1 < 3) goto LAB_0011f452;
    goto LAB_00120446;
  case '\x04':
  case '\b':
  case '\r':
  case '\x11':
    raviX_buffer_add_string(mb,"{ ");
    pPVar7 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->targets,0);
    if (((undefined1  [48])*pPVar7 & (undefined1  [48])0xf) == (undefined1  [48])0x1) {
      emit_varname(fn,pPVar7);
      pcVar14 = " = ";
    }
    else {
      raviX_buffer_add_string(mb,"TValue *dst_reg = ");
      emit_reg_accessor(fn,pPVar7,0);
      pcVar14 = "; setfltvalue(dst_reg, ";
    }
    raviX_buffer_add_string(mb,pcVar14);
    bVar3 = *(byte *)insn;
    if (bVar3 < 0xd) {
      if (bVar3 == 4) {
        pcVar14 = "+";
      }
      else {
        if (bVar3 != 8) goto switchD_0011f36a_caseD_31;
        pcVar14 = "-";
      }
    }
    else if (bVar3 == 0xd) {
      pcVar14 = "*";
    }
    else {
      if (bVar3 != 0x11) goto switchD_0011f36a_caseD_31;
      pcVar14 = "/";
    }
    pPVar8 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,0);
    emit_varname_or_constant(fn,pPVar8);
    raviX_buffer_add_fstring(mb," %s ((lua_Number)(",pcVar14);
    pPVar8 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,1);
    emit_varname_or_constant(fn,pPVar8);
    raviX_buffer_add_string(mb,"))");
    goto LAB_00120436;
  case '\t':
  case '\x12':
    raviX_buffer_add_string(mb,"{ ");
    pPVar7 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->targets,0);
    if (((undefined1  [48])*pPVar7 & (undefined1  [48])0xf) == (undefined1  [48])0x1) {
      emit_varname(fn,pPVar7);
      pcVar14 = " = ";
    }
    else {
      raviX_buffer_add_string(mb,"TValue *dst_reg = ");
      emit_reg_accessor(fn,pPVar7,0);
      pcVar14 = "; setfltvalue(dst_reg, ";
    }
    raviX_buffer_add_string(mb,pcVar14);
    if (*(char *)insn == '\t') {
      pcVar14 = "-";
    }
    else {
      if (*(char *)insn != '\x12') goto switchD_0011f36a_caseD_31;
      pcVar14 = "/";
    }
    raviX_buffer_add_string(mb,"((lua_Number)(");
    pPVar8 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,0);
    emit_varname_or_constant(fn,pPVar8);
    raviX_buffer_add_fstring(mb,")) %s ",pcVar14);
    pPVar8 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,1);
    emit_varname_or_constant(fn,pPVar8);
LAB_00120436:
    if (((undefined1  [48])*pPVar7 & (undefined1  [48])0xf) == (undefined1  [48])0x1) {
LAB_0011f452:
      pcVar14 = "; }\n";
    }
    else {
LAB_00120446:
      pcVar14 = "); }\n";
    }
    goto LAB_0012044d;
  case '\x0f':
    uVar15 = 5;
    goto LAB_0011ffc7;
  case '\x14':
    uVar15 = 6;
    goto LAB_0011ffc7;
  case '\x15':
    uVar15 = 7;
    goto LAB_0011ffc7;
  case '\x17':
    uVar15 = 8;
    goto LAB_0011ffc7;
  case '\x19':
    uVar15 = 9;
    goto LAB_0011ffc7;
  case '\x1b':
    uVar15 = 10;
    goto LAB_0011ffc7;
  case '\x1c':
  case '\x1e':
    raviX_buffer_add_string(mb,"{\n ");
    pPVar7 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->targets,0);
    if ((*(uint *)pPVar7 & 0xf) - 1 < 3) {
      emit_varname(fn,pPVar7);
      pcVar14 = " = ";
    }
    else {
      raviX_buffer_add_string(mb,"TValue *dst_reg = ");
      emit_reg_accessor(fn,pPVar7,0);
      pcVar14 = "; setivalue(dst_reg, ";
    }
    raviX_buffer_add_string(mb,pcVar14);
    raviX_buffer_add_string(mb,"luaV_shiftl(");
    pPVar8 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,0);
    emit_varname_or_constant(fn,pPVar8);
    if (*(char *)insn == '\x1c') {
      pcVar14 = ", ";
    }
    else {
      if (*(char *)insn != '\x1e') goto switchD_0011f36a_caseD_31;
      pcVar14 = ", -";
    }
    raviX_buffer_add_string(mb,pcVar14);
    pPVar8 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,1);
    emit_varname_or_constant(fn,pPVar8);
    raviX_buffer_add_string(mb,")");
    if ((*(uint *)pPVar7 & 0xf) - 1 < 3) {
      pcVar14 = ";\n}\n";
    }
    else {
      pcVar14 = ");\n}\n";
    }
    goto LAB_0011f6e9;
  case '\x1d':
    uVar15 = 0xb;
    goto LAB_0011ffc7;
  case '\x1f':
  case '\"':
  case '%':
    pcVar14 = "==";
    if (cVar1 == '%') {
      pcVar14 = "<=";
    }
    pcVar12 = "<";
    if (cVar1 != '\"') {
      pcVar12 = pcVar14;
    }
    pcVar14 = "luaV_lessequal";
    if (cVar1 == '\"') {
      pcVar14 = "luaV_lessthan";
    }
    pcVar11 = "luaV_equalobj";
    if (cVar1 != '\x1f') {
      pcVar11 = pcVar14;
    }
    raviX_buffer_add_string(mb,"{\n int result = 0;\n");
    raviX_buffer_add_string(mb," TValue *rb = ");
    pPVar7 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,0);
    emit_reg_accessor(fn,pPVar7,0);
    raviX_buffer_add_string(mb,";\n TValue *rc = ");
    pPVar7 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,1);
    emit_reg_accessor(fn,pPVar7,1);
    raviX_buffer_add_string(mb,";\n");
    raviX_buffer_add_string(mb," if (ttisinteger(rb) && ttisinteger(rc))\n");
    raviX_buffer_add_fstring(mb,"  result = (ivalue(rb) %s ivalue(rc));\n",pcVar12);
    raviX_buffer_add_string(mb," else {\n");
    raviX_buffer_add_fstring(mb,"  result = %s(L, rb, rc);\n  ",pcVar11);
    raviX_buffer_add_string(mb,"base = ci->u.l.base;\n");
    raviX_buffer_add_string(mb," }\n");
    pPVar7 = (Pseudo *)raviX_ptrlist_first((PtrList *)insn->targets);
    if ((*(uint *)pPVar7 & 0xf) == 3) {
      raviX_buffer_add_string(mb," ");
      emit_varname(fn,pPVar7);
      pcVar14 = " = result != 0;\n";
    }
    else {
      if ((*(uint *)pPVar7 & 0xf) != 4) {
        handle_error_bad_pseudo(fn,pPVar7,"Unexpected pseudo");
      }
      raviX_buffer_add_string(mb," setbvalue(");
      emit_reg_accessor(fn,pPVar7,0);
      pcVar14 = ", result != 0);\n";
    }
    goto LAB_0011f6da;
  case ' ':
  case '!':
  case '#':
  case '$':
  case '&':
  case '\'':
    raviX_buffer_add_string(mb,"{ ");
    pPVar7 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->targets,0);
    if (((undefined1  [48])*pPVar7 & (undefined1  [48])0xf) == (undefined1  [48])0x3) {
      emit_varname(fn,pPVar7);
      pcVar14 = " = ";
    }
    else {
      raviX_buffer_add_string(mb,"TValue *dst_reg = ");
      emit_reg_accessor(fn,pPVar7,0);
      pcVar14 = "; setbvalue(dst_reg, ";
    }
    raviX_buffer_add_string(mb,pcVar14);
    bVar3 = *(char *)insn - 0x20;
    if ((7 < bVar3) || ((0xdbU >> (bVar3 & 0x1f) & 1) == 0)) goto switchD_0011f36a_caseD_31;
    iVar6 = *(int *)(&DAT_0013d530 + (ulong)bVar3 * 4);
    pPVar8 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,0);
    emit_varname_or_constant(fn,pPVar8);
    raviX_buffer_add_fstring(mb," %s ",&DAT_0013d530 + iVar6);
    pPVar8 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,1);
    emit_varname_or_constant(fn,pPVar8);
    if (((undefined1  [48])*pPVar7 & (undefined1  [48])0xf) != (undefined1  [48])0x3)
    goto LAB_00120446;
    goto LAB_0011f452;
  case '(':
    uVar15 = 3;
    goto LAB_0011ffc7;
  case ')':
    uVar15 = 4;
LAB_0011ffc7:
    pPVar7 = (Pseudo *)raviX_ptrlist_first((PtrList *)insn->targets);
    raviX_buffer_add_string(mb,"{\n");
    raviX_buffer_add_string(mb," TValue *ra = ");
    emit_reg_accessor(fn,pPVar7,0);
    raviX_buffer_add_string(mb,";\n TValue *rb = ");
    pPVar8 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,0);
    emit_reg_accessor(fn,pPVar8,1);
    raviX_buffer_add_string(mb,";\n TValue *rc = ");
    pPVar8 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,1);
    emit_reg_accessor(fn,pPVar8,2);
    raviX_buffer_add_fstring(mb,";\n luaO_arith(L, %d, rb, rc, ra);\n",uVar15);
    raviX_buffer_add_string(mb,"base = ci->u.l.base;\n");
    if ((*(uint *)pPVar7 & 0xf) - 1 < 3) {
      raviX_buffer_add_string(mb," ");
      emit_varname(fn,pPVar7);
      raviX_buffer_add_string(mb," = ");
      pcVar12 = " bvalue(ra);\n";
      if ((*(uint *)pPVar7 & 0xf) == 2) {
        pcVar12 = " ivalue(ra);\n";
      }
      pcVar14 = " fltvalue(ra);\n";
      if ((*(uint *)pPVar7 & 0xf) != 1) {
        pcVar14 = pcVar12;
      }
LAB_001200db:
      raviX_buffer_add_string(mb,pcVar14);
    }
LAB_001200e3:
    pcVar14 = "}\n";
LAB_0012044d:
    raviX_buffer_add_string(mb,pcVar14);
    return 0;
  case '*':
    emit_op_closure(fn,insn);
    break;
  case '+':
    emit_op_unm(fn,insn);
    break;
  case ',':
  case '-':
    pPVar7 = (Pseudo *)raviX_ptrlist_first((PtrList *)insn->targets);
    pPVar8 = (Pseudo *)raviX_ptrlist_first((PtrList *)insn->operands);
    bVar16 = *(char *)insn == ',';
    pcVar14 = "setfltvalue";
    if (bVar16) {
      pcVar14 = "setivalue";
    }
    pcVar12 = "setfltvalue";
    if (bVar16) {
      pcVar12 = "setivalue";
    }
    uVar4 = bVar16 + 1;
    raviX_buffer_add_string(mb,"{\n");
    if ((*(uint *)pPVar8 & 0xf) != 5 && (*(uint *)pPVar8 & 0xf) != uVar4) {
      raviX_buffer_add_string(mb," TValue *rb = ");
      emit_reg_accessor(fn,pPVar8,0);
      raviX_buffer_add_string(mb,";\n");
    }
    uVar5 = *(uint *)pPVar7 & 0xf;
    if (uVar5 == uVar4) {
      raviX_buffer_add_string(mb," ");
      emit_varname(fn,pPVar7);
      raviX_buffer_add_string(mb," = -");
      if ((*(uint *)pPVar8 & 0xf) == 5 || (*(uint *)pPVar8 & 0xf) == uVar4) {
        emit_varname_or_constant(fn,pPVar8);
      }
      else {
        raviX_buffer_add_fstring(mb,"%s(rb)",pcVar12 + 3);
      }
      pcVar14 = ";\n";
    }
    else {
      if ((0xd < uVar5) || ((0x2011U >> uVar5 & 1) == 0)) {
        handle_error_bad_pseudo(fn,pPVar7,"Unexpected pseudo");
      }
      raviX_buffer_add_string(mb," TValue *ra = ");
      emit_reg_accessor(fn,pPVar7,0);
      raviX_buffer_add_fstring(mb,";\n %s(ra, ",pcVar14);
      if ((*(uint *)pPVar8 & 0xf) == 5 || (*(uint *)pPVar8 & 0xf) == uVar4) {
        emit_varname_or_constant(fn,pPVar8);
      }
      else {
        raviX_buffer_add_fstring(mb,"%s(rb)",pcVar12 + 3);
      }
      pcVar14 = ");\n";
    }
    goto LAB_0011f6da;
  case '.':
  case '/':
    pPVar7 = (Pseudo *)raviX_ptrlist_first((PtrList *)insn->operands);
    pPVar8 = (Pseudo *)raviX_ptrlist_first((PtrList *)insn->targets);
    raviX_buffer_add_string(mb,"{\n TValue *len = ");
    emit_reg_accessor(fn,pPVar8,0);
    raviX_buffer_add_string(mb,";\n TValue *obj = ");
    emit_reg_accessor(fn,pPVar7,0);
    raviX_buffer_add_string(mb,";\n luaV_objlen(L, len, obj);\n");
    raviX_buffer_add_string(mb,"base = ci->u.l.base;\n");
    if (((undefined1  [48])*pPVar8 & (undefined1  [48])0xf) == (undefined1  [48])0x2) {
      raviX_buffer_add_string(mb," ");
      emit_varname_or_constant(fn,pPVar8);
      pcVar14 = " = ival0.value_.i;\n";
      goto LAB_001200db;
    }
    goto LAB_001200e3;
  case '0':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
    raviX_buffer_add_string(mb,"{\n");
    raviX_buffer_add_string(mb," TValue *ra = ");
    pPVar7 = (Pseudo *)raviX_ptrlist_first((PtrList *)insn->targets);
    emit_reg_accessor(fn,pPVar7,0);
    switch(*(undefined1 *)insn) {
    case 0x30:
      raviX_buffer_add_string(mb,";\n lua_Integer i = 0;\n");
      uVar15 = 0;
      pcVar14 = " if (!tointegerns(ra, &i)) {\n";
      break;
    default:
      goto switchD_0011f36a_caseD_31;
    case 0x32:
      uVar15 = 0xf;
      pcVar14 = ";\n if (!ttisnil(ra) && !ttisclosure(ra)) {\n";
      break;
    case 0x33:
      uVar15 = 0xe;
      pcVar14 = ";\n if (!ttisnil(ra) && !ttisstring(ra)) {\n";
      break;
    case 0x34:
      uVar15 = 2;
      pcVar14 = ";\n if (!ttisiarray(ra)) {\n";
      break;
    case 0x35:
      uVar15 = 3;
      pcVar14 = ";\n if (!ttisfarray(ra)) {\n";
      break;
    case 0x36:
      uVar15 = 4;
      pcVar14 = ";\n if (!ttisLtable(ra)) {\n";
    }
    raviX_buffer_add_string(mb,pcVar14);
    raviX_buffer_add_fstring(mb,"  raviX__error_code = %d;\n",uVar15);
    raviX_buffer_add_string(mb,"  goto Lraise_error;\n");
    pcVar14 = " }\n}\n";
    goto LAB_0012044d;
  case '1':
    emit_op_toflt(fn,insn);
    break;
  case '7':
    emit_op_tousertype(fn,insn);
    break;
  case '8':
    emit_op_not(fn,insn);
    break;
  case '9':
    emit_op_bnot(fn,insn);
    break;
  case ':':
  case 'P':
  case 'Q':
  case 'R':
  case 'S':
  case 'T':
  case 'U':
  case 'V':
  case 'X':
    pcVar12 = "luaV_gettable";
    if (cVar1 == 'U') {
      pcVar12 = "raviV_gettable_sskey";
    }
    pcVar14 = "raviV_gettable_i";
    if (cVar1 != 'T') {
      pcVar14 = pcVar12;
    }
    pPVar7 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,0);
    pPVar8 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,1);
    pPVar9 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->targets,0);
    if (((((undefined1  [48])*pPVar8 & (undefined1  [48])0xf) == (undefined1  [48])0x5) &&
        (((pPVar8->field_3).constant)->type == 0x101)) &&
       (((((pPVar8->field_3).constant)->field_2).s)->len < 0x28)) {
      pcVar14 = "raviV_gettable_sskey";
    }
    raviX_buffer_add_string(mb,"{\n");
    raviX_buffer_add_string(mb," TValue *tab = ");
    emit_reg_accessor(fn,pPVar7,0);
    raviX_buffer_add_string(mb,";\n TValue *key = ");
    emit_reg_accessor(fn,pPVar8,0);
    raviX_buffer_add_string(mb,";\n TValue *dst = ");
    emit_reg_accessor(fn,pPVar9,1);
    pcVar12 = ";\n %s(L, tab, key, dst);\n ";
    goto LAB_0011f6cc;
  case ';':
    emit_op_newtable(fn,insn);
    break;
  case '<':
  case '=':
    emit_op_newarray(fn,insn);
    break;
  case '>':
  case '?':
  case '@':
  case 'A':
  case 'B':
  case 'C':
  case 'D':
  case 'F':
  case 'Z':
    pPVar7 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,0);
    if (*(char *)insn == 'C') {
      pcVar14 = "raviV_settable_sskey";
    }
    else if (*(char *)insn == 'B') {
      if (((undefined1  [48])*pPVar7 & (undefined1  [48])0xf) == (undefined1  [48])0xb)
      goto LAB_0011fc6a;
      pcVar14 = "raviV_settable_i";
    }
    else {
      pcVar14 = "luaV_settable";
    }
    pPVar8 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->targets,0);
    pPVar9 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->targets,1);
    if (((((undefined1  [48])*pPVar9 & (undefined1  [48])0xf) == (undefined1  [48])0x5) &&
        (((pPVar9->field_3).constant)->type == 0x101)) &&
       (((((pPVar9->field_3).constant)->field_2).s)->len < 0x28)) {
      pcVar14 = "raviV_settable_sskey";
    }
    raviX_buffer_add_string(mb,"{\n");
    raviX_buffer_add_string(mb," TValue *tab = ");
    emit_reg_accessor(fn,pPVar8,0);
    raviX_buffer_add_string(mb,";\n TValue *key = ");
    emit_reg_accessor(fn,pPVar9,0);
    raviX_buffer_add_string(mb,";\n TValue *src = ");
    emit_reg_accessor(fn,pPVar7,1);
    pcVar12 = ";\n %s(L, tab, key, src);\n ";
LAB_0011f6cc:
    raviX_buffer_add_fstring(mb,pcVar12,pcVar14);
    pcVar14 = "base = ci->u.l.base;\n";
LAB_0011f6da:
    raviX_buffer_add_string(mb,pcVar14);
LAB_0011f6e2:
    pcVar14 = "}\n";
LAB_0011f6e9:
    raviX_buffer_add_string(mb,pcVar14);
    break;
  case 'E':
  case 'G':
    bVar16 = cVar1 == 'E';
    pcVar14 = "lua_Number *";
    if (bVar16) {
      pcVar14 = "lua_Integer *";
    }
    pcVar12 = "setfltvalue";
    if (bVar16) {
      pcVar12 = "setivalue";
    }
    pcVar11 = "raviH_set_float";
    if (bVar16) {
      pcVar11 = "raviH_set_int";
    }
    pPVar7 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->targets,0);
    pPVar8 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->targets,1);
    pPVar9 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,0);
    if (((undefined1  [48])*pPVar9 & (undefined1  [48])0xf) == (undefined1  [48])0xb) {
LAB_0011fc6a:
      emit_store_range_to_table(fn,insn);
      return 0;
    }
    raviX_buffer_add_string(mb,"{\n");
    raviX_buffer_add_string(mb," RaviArray *arr = arrvalue(");
    emit_reg_accessor(fn,pPVar7,0);
    raviX_buffer_add_string(mb,");\n lua_Unsigned ukey = (lua_Unsigned) ");
    uVar4 = *(uint *)pPVar8 & 0xf;
    if (uVar4 == 0) {
      raviX_buffer_add_string(mb,"ivalue(");
      emit_reg_accessor(fn,pPVar8,0);
      raviX_buffer_add_string(mb,")");
    }
    else if (uVar4 == 2) {
      emit_varname(fn,pPVar8);
    }
    else {
      if (uVar4 != 5) goto LAB_001207e8;
      raviX_buffer_add_fstring(mb,"%lld",((pPVar8->field_3).proc)->nodes);
    }
    raviX_buffer_add_string(mb,";\n");
    raviX_buffer_add_fstring(mb," %siptr = (%s)arr->data;\n ",pcVar14,pcVar14);
    raviX_buffer_add_string(mb,"if (ukey < (lua_Unsigned)(arr->len)) {\n");
    raviX_buffer_add_string(mb," iptr[ukey] = ");
    uVar4 = *(uint *)pPVar9 & 0xf;
    if (uVar4 == bVar16 + 1) {
      emit_varname(fn,pPVar9);
    }
    else {
      if (uVar4 < 5) {
        if ((uVar4 != 0) && (uVar4 != 4)) {
LAB_00120631:
          pRVar10 = fn->api;
          pvVar13 = pRVar10->context;
          pcVar14 = "Unexpected src pseudo";
          goto LAB_001207c2;
        }
      }
      else {
        if (uVar4 == 5) {
          pCVar2 = (pPVar9->field_3).constant;
          if (pCVar2->type == 8) {
            raviX_buffer_add_fstring(mb,"%lld",(pCVar2->field_2).i);
          }
          else {
            raviX_buffer_add_fstring(mb,"%g",(pCVar2->field_2).i);
          }
          goto LAB_00120684;
        }
        if (uVar4 != 0xd) goto LAB_00120631;
      }
      raviX_buffer_add_fstring(mb,"%s(",pcVar12 + 3);
      emit_reg_accessor(fn,pPVar9,0);
      raviX_buffer_add_string(mb,")");
    }
LAB_00120684:
    raviX_buffer_add_string(mb,";\n} else {\n");
    raviX_buffer_add_fstring(mb," %s(L, arr, ukey, ",pcVar11);
    uVar4 = *(uint *)pPVar9 & 0xf;
    if (uVar4 == bVar16 + 1) {
      emit_varname(fn,pPVar9);
    }
    else if (uVar4 < 5) {
      if ((uVar4 == 0) || (uVar4 == 4)) {
LAB_001206da:
        raviX_buffer_add_fstring(mb,"%s(",pcVar12 + 3);
        emit_reg_accessor(fn,pPVar9,0);
        raviX_buffer_add_string(mb,")");
      }
    }
    else if (uVar4 == 5) {
      pCVar2 = (pPVar9->field_3).constant;
      if (pCVar2->type == 8) {
        raviX_buffer_add_fstring(mb,"%lld",(pCVar2->field_2).i);
      }
      else {
        raviX_buffer_add_fstring(mb,"%g",(pCVar2->field_2).i);
      }
    }
    else if (uVar4 == 0xd) goto LAB_001206da;
    raviX_buffer_add_string(mb,");\n");
    pcVar14 = "}\n}\n";
    goto LAB_0011f6e9;
  case 'H':
    iVar6 = emit_op_cbr(fn,insn);
    return iVar6;
  case 'I':
    emit_op_br(fn,insn);
    break;
  case 'J':
  case 'K':
  case 'M':
    pPVar7 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,0);
    pPVar8 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->targets,0);
    iVar6 = emit_move(fn,pPVar7,pPVar8);
    return iVar6;
  case 'L':
    iVar6 = emit_op_movif(fn,insn);
    return iVar6;
  case 'N':
    iVar6 = emit_op_movfi(fn,insn);
    return iVar6;
  case 'O':
    emit_op_call(fn,insn);
    break;
  case 'W':
  case 'Y':
    bVar16 = cVar1 == 'W';
    pcVar14 = "lua_Number *";
    if (bVar16) {
      pcVar14 = "lua_Integer *";
    }
    pcVar12 = "setfltvalue";
    if (bVar16) {
      pcVar12 = "setivalue";
    }
    pPVar7 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,0);
    pPVar8 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,1);
    pPVar9 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->targets,0);
    raviX_buffer_add_string(mb,"{\n");
    raviX_buffer_add_string(mb," RaviArray *arr = arrvalue(");
    emit_reg_accessor(fn,pPVar7,0);
    raviX_buffer_add_string(mb,");\n lua_Unsigned ukey = (lua_Unsigned) ");
    uVar4 = *(uint *)pPVar8 & 0xf;
    if (uVar4 == 0) {
      raviX_buffer_add_string(mb,"ivalue(");
      emit_reg_accessor(fn,pPVar8,0);
      raviX_buffer_add_string(mb,")");
    }
    else if (uVar4 == 2) {
      emit_varname(fn,pPVar8);
    }
    else {
      if (uVar4 != 5) {
LAB_001207e8:
        pRVar10 = fn->api;
        pvVar13 = pRVar10->context;
        pcVar14 = "Unexpected key pseudo";
        goto LAB_001207c2;
      }
      raviX_buffer_add_fstring(mb,"%lld",((pPVar8->field_3).proc)->nodes);
    }
    raviX_buffer_add_string(mb,";\n");
    raviX_buffer_add_fstring(mb," %siptr = (%s)arr->data;\n ",pcVar14);
    uVar4 = *(uint *)pPVar9 & 0xf;
    if (uVar4 == bVar16 + 1) {
      emit_varname(fn,pPVar9);
      pcVar14 = " = iptr[ukey];\n";
      goto LAB_0011f6da;
    }
    if ((0xd < uVar4) || ((0x2011U >> uVar4 & 1) == 0)) {
      pRVar10 = fn->api;
      pvVar13 = pRVar10->context;
      pcVar14 = "Unexpected dest pseudo";
      goto LAB_001207c2;
    }
    raviX_buffer_add_string(mb,"TValue *dest_reg = ");
    emit_reg_accessor(fn,pPVar9,0);
    raviX_buffer_add_fstring(mb,"; %s(dest_reg, iptr[ukey]);\n",pcVar12);
    goto LAB_0011f6e2;
  case '[':
    emit_op_close(fn,insn);
    break;
  case '\\':
    emit_op_concat(fn,insn);
    break;
  case ']':
    iVar6 = emit_op_init(fn,insn);
    return iVar6;
  case '^':
    iVar6 = emit_op_C__unsafe(fn,insn);
    return iVar6;
  case '_':
    iVar6 = emit_op_C__new(fn,insn);
    return iVar6;
  default:
    output_instruction_cold_1();
    return -1;
  }
  return 0;
}

Assistant:

static int output_instruction(Function *fn, Instruction *insn)
{
	int rc = 0;

	// Output the IR instruction we are compiling
	raviX_buffer_reset(&fn->tb);
	raviX_output_instruction(insn, &fn->tb);
	raviX_buffer_add_fstring(&fn->body, "// %s\n", fn->tb.buf);
	raviX_buffer_reset(&fn->tb);

	switch (insn->opcode) {
	case op_ret:
		rc = emit_op_ret(fn, insn);
		break;
	case op_br:
		rc = emit_op_br(fn, insn);
		break;
	case op_cbr:
		rc = emit_op_cbr(fn, insn);
		break;
	case op_mov:
	case op_movi:
	case op_movf:
		rc = emit_op_mov(fn, insn);
		break;
	case op_movfi:
		rc = emit_op_movfi(fn, insn);
		break;
	case op_movif:
		rc = emit_op_movif(fn, insn);
		break;
	case op_loadglobal:
	case op_get:
	case op_get_skey:
	case op_get_ikey:
	case op_tget_skey:
	case op_tget_ikey:
	case op_tget: /* TODO custom codegen */
	case op_iaget:
	case op_faget:
		rc = emit_op_load_table(fn, insn);
		break;
	case op_storeglobal:
	case op_put:
	case op_put_skey:
	case op_put_ikey:
	case op_tput_skey:
	case op_tput_ikey:
	case op_tput: /* TODO custom codegen */
	case op_iaput:
	case op_faput:
		rc = emit_op_store_table(fn, insn);
		break;
	case op_call:
		rc = emit_op_call(fn, insn);
		break;

	case op_addff:
	case op_subff:
	case op_mulff:
	case op_divff:

	case op_addii:
	case op_subii:
	case op_mulii:
	case op_divii:
	case op_bandii:
	case op_borii:
	case op_bxorii:
		rc = emit_bin_ii(fn, insn);
		break;

	case op_shlii:
	case op_shrii:
		rc = emit_bitop_ii(fn, insn);
		break;

	case op_eqii:
	case op_ltii:
	case op_leii:
	case op_eqff:
	case op_ltff:
	case op_leff:
		rc = emit_comp_ii(fn, insn);
		break;

	case op_addfi:
	case op_subfi:
	case op_mulfi:
	case op_divfi:
		rc = emit_bin_fi(fn, insn);
		break;

	case op_subif:
	case op_divif:
		rc = emit_bin_if(fn, insn);
		break;

	case op_add:
	case op_sub:
	case op_mul:
		rc = emit_op_arith(fn, insn);
		break;

	case op_not:
		rc = emit_op_not(fn, insn);
		break;

	case op_bnot:
		rc = emit_op_bnot(fn, insn);
		break;

	case op_div:
	case op_idiv:
	case op_band:
	case op_bor:
	case op_bxor:
	case op_shl:
	case op_shr:
	case op_mod:
	case op_pow:
		rc = emit_op_binary(fn, insn);
		break;

	case op_unmi:
	case op_unmf:
		rc = emit_op_unmi_unmf(fn, insn);
		break;

	case op_unm:
		rc = emit_op_unm(fn, insn);
		break;

	case op_eq:
	case op_lt:
	case op_le:
		rc = emit_generic_comp(fn, insn);
		break;

	case op_iaget_ikey:
	case op_faget_ikey:
		rc = emit_op_arrayget_ikey(fn, insn);
		break;

	case op_iaput_ival:
	case op_faput_fval:
		rc = emit_op_arrayput_val(fn, insn);
		break;

	case op_toiarray:
	case op_tofarray:
	case op_totable:
	case op_tostring:
	case op_toclosure:
	case op_toint:
		rc = emit_op_totype(fn, insn);
		break;

	case op_toflt:
		rc = emit_op_toflt(fn, insn);
		break;

	case op_totype:
		rc = emit_op_tousertype(fn, insn);
		break;

	case op_closure:
		rc = emit_op_closure(fn, insn);
		break;

	case op_newtable:
		rc = emit_op_newtable(fn, insn);
		break;

	case op_newiarray:
		rc = emit_op_newarray(fn, insn);
		break;

	case op_newfarray:
		rc = emit_op_newarray(fn, insn);
		break;

	case op_close:
		rc = emit_op_close(fn, insn);
		break;

	case op_len:
	case op_leni:
		rc = emit_op_len(fn, insn);
		break;

	case op_concat:
		rc = emit_op_concat(fn, insn);
		break;

	case op_init:
		rc = emit_op_init(fn, insn);
		break;

	case op_C__unsafe:
		rc = emit_op_C__unsafe(fn, insn);
		break;

	case op_C__new:
		rc = emit_op_C__new(fn, insn);
		break;

	default:
		fprintf(stderr, "Unsupported opcode %s\n", raviX_opcode_name(insn->opcode));
		rc = -1;
	}
	return rc;
}